

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

char * ByteToHex(uchar *vByte,int vLen)

{
  char cVar1;
  int local_30;
  int i;
  int tmp2;
  char *tmp;
  int vLen_local;
  uchar *vByte_local;
  
  if (vByte == (uchar *)0x0) {
    vByte_local = (uchar *)0x0;
  }
  else {
    vByte_local = (uchar *)operator_new__((long)(vLen * 2 + 1));
    for (local_30 = 0; local_30 < vLen; local_30 = local_30 + 1) {
      cVar1 = '0';
      if (9 < vByte[local_30] / 0x10) {
        cVar1 = '7';
      }
      vByte_local[local_30 << 1] = (char)(vByte[local_30] / 0x10) + cVar1;
      cVar1 = '0';
      if (9 < (uint)vByte[local_30] % 0x10) {
        cVar1 = '7';
      }
      vByte_local[local_30 * 2 + 1] = (char)((uint)vByte[local_30] % 0x10) + cVar1;
    }
    vByte_local[vLen << 1] = '\0';
  }
  return (char *)vByte_local;
}

Assistant:

char* ByteToHex(const unsigned char* vByte, const int vLen)
{
	if (!vByte)
	{
		return NULL;
	}

	char* tmp = new char[vLen * 2 + 1];

	int tmp2;
	for (int i = 0; i < vLen; i++)
	{
		tmp2 = (int)(vByte[i]) / 16;
		tmp[i * 2] = (char)(tmp2 + ((tmp2 > 9) ? 'A' - 10 : '0'));
		tmp2 = (int)(vByte[i]) % 16;
		tmp[i * 2 + 1] = (char)(tmp2 + ((tmp2 > 9) ? 'A' - 10 : '0'));
	}

	tmp[vLen * 2] = '\0';
	return tmp;
}